

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O0

void ContextSkip(j_decompress_ptr cinfo,long jump_size)

{
  jpeg_source_mgr *pjVar1;
  size_t jump;
  JPEGReadContext *ctx;
  long jump_size_local;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->src;
  jump = jump_size;
  if (pjVar1->bytes_in_buffer < (ulong)jump_size) {
    jump = pjVar1->bytes_in_buffer;
  }
  pjVar1->bytes_in_buffer = pjVar1->bytes_in_buffer - jump;
  pjVar1->next_input_byte = pjVar1->next_input_byte + jump;
  return;
}

Assistant:

static void ContextSkip(j_decompress_ptr cinfo, long jump_size) {
  JPEGReadContext* const ctx = (JPEGReadContext*)cinfo->src;
  size_t jump = (size_t)jump_size;
  if (jump > ctx->pub.bytes_in_buffer) {  // Don't overflow the buffer.
    jump = ctx->pub.bytes_in_buffer;
  }
  ctx->pub.bytes_in_buffer -= jump;
  ctx->pub.next_input_byte += jump;
}